

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O2

bool __thiscall
gss::innards::HomomorphismSearcher::propagate
          (HomomorphismSearcher *this,bool initial,Domains *new_domains,
          HomomorphismAssignments *assignments,bool propagate_using_lackey)

{
  uint *puVar1;
  pointer pHVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  HomomorphismDomain *pHVar5;
  Proof *this_00;
  pointer pHVar6;
  Lackey *this_01;
  _List_node_base _Var7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  uint uVar11;
  pointer pHVar12;
  __normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
  _Var13;
  uint uVar14;
  _List_node_base *p_Var15;
  undefined7 in_register_00000031;
  HomomorphismSearcher *this_02;
  _List_node_base *p_Var16;
  _Self __tmp;
  const_iterator cVar17;
  pointer pHVar18;
  vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
  *__range2;
  bool wipeout;
  uint local_ec;
  Domains *__range4;
  HomomorphismSearcher *local_e0;
  allocator_type local_d1;
  pointer local_d0;
  optional<gss::innards::HomomorphismAssignment> current_assignment;
  int dcount;
  undefined1 local_98 [16];
  _Manager_type p_Stack_88;
  code *apcStack_80 [2];
  VertexToVertexMapping mapping;
  anon_class_8_1_52b55ef0 find_unit_domain;
  
  __range4 = new_domains;
  local_e0 = this;
  if (((int)CONCAT71(in_register_00000031,initial) != 0) &&
     (bVar8 = might_have_watches(this->params), bVar8)) {
    pHVar12 = (assignments->values).
              super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pHVar2 = (assignments->values).
             super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    while (pHVar12 != pHVar2) {
      uVar14 = (pHVar12->assignment).pattern_vertex;
      uVar11 = (pHVar12->assignment).target_vertex;
      local_ec = 0;
      p_Var16 = (_List_node_base *)
                ((this->watches).table.data.
                 super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                ((this->watches).table.target_size * uVar14 + uVar11));
      cVar17._M_node = p_Var16;
      local_d0 = pHVar12;
LAB_0012b78e:
      cVar17._M_node =
           (((_List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
              *)&(cVar17._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      while (cVar17._M_node != p_Var16) {
        p_Var3 = cVar17._M_node[1]._M_next;
        p_Var15 = p_Var3[1]._M_next;
        if ((*(uint *)&p_Var15->_M_next != uVar14) ||
           (*(uint *)((long)&p_Var15->_M_next + 4) != uVar11)) {
          _Var7 = (_List_node_base)vpermilps_avx((undefined1  [16])*p_Var15,0x4e);
          *p_Var15 = _Var7;
          p_Var15 = p_Var3[1]._M_next;
        }
        p_Var15 = p_Var15 + 1;
        while( true ) {
          if (p_Var15 == p_Var3[1]._M_prev) {
            p_Var3 = p_Var3[1]._M_next;
            pHVar18 = (__range4->
                      super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            goto LAB_0012b84d;
          }
          bVar8 = HomomorphismAssignments::contains(assignments,(HomomorphismAssignment *)p_Var15);
          if (!bVar8) break;
          p_Var15 = (_List_node_base *)&p_Var15->_M_prev;
        }
        p_Var4 = (p_Var3[1]._M_next)->_M_next;
        (p_Var3[1]._M_next)->_M_next = p_Var15->_M_next;
        p_Var15->_M_next = p_Var4;
        p_Var3 = (p_Var3[1]._M_next)->_M_next;
        std::__cxx11::
        list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
        ::push_back((local_e0->watches).table.data.
                    super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                    ((local_e0->watches).table.target_size * (int)p_Var3 +
                    (int)((ulong)p_Var3 >> 0x20)),(value_type *)(cVar17._M_node + 1));
        p_Var3 = (cVar17._M_node)->_M_next;
        std::__cxx11::
        list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
        ::erase((list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                 *)p_Var16,cVar17);
        cVar17._M_node = p_Var3;
      }
      pHVar12 = local_d0 + 1;
      this = local_e0;
      if ((local_ec & 1) != 0) {
        return false;
      }
    }
  }
  this_02 = (HomomorphismSearcher *)&find_unit_domain;
  find_unit_domain.new_domains = __range4;
  _Var13 = propagate::anon_class_8_1_52b55ef0::operator()((anon_class_8_1_52b55ef0 *)this_02);
  local_d0 = (pointer)&this->proof;
  bVar9 = 0;
  while( true ) {
    pHVar5 = (__range4->
             super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((bool)(bVar9 & _Var13._M_current == pHVar5)) break;
    current_assignment.super__Optional_base<gss::innards::HomomorphismAssignment,_true,_true>.
    _M_payload.super__Optional_payload_base<gss::innards::HomomorphismAssignment>._M_engaged = false
    ;
    if (_Var13._M_current != pHVar5) {
      uVar14 = (_Var13._M_current)->v;
      uVar11 = SVOBitset::find_first(&(_Var13._M_current)->values);
      if (current_assignment.super__Optional_base<gss::innards::HomomorphismAssignment,_true,_true>.
          _M_payload.super__Optional_payload_base<gss::innards::HomomorphismAssignment>._M_engaged
          == false) {
        current_assignment.super__Optional_base<gss::innards::HomomorphismAssignment,_true,_true>.
        _M_payload.super__Optional_payload_base<gss::innards::HomomorphismAssignment>._M_engaged =
             true;
      }
      current_assignment.super__Optional_base<gss::innards::HomomorphismAssignment,_true,_true>.
      _M_payload.super__Optional_payload_base<gss::innards::HomomorphismAssignment>._M_payload.
      _M_value.target_vertex = uVar11;
      current_assignment.super__Optional_base<gss::innards::HomomorphismAssignment,_true,_true>.
      _M_payload.super__Optional_payload_base<gss::innards::HomomorphismAssignment>._M_payload.
      _M_value.pattern_vertex = uVar14;
      (_Var13._M_current)->fixed = true;
      mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
      mapping._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0xffffffff;
      mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0xffffffff;
      mapping._M_t._M_impl._0_8_ =
           current_assignment.super__Optional_base<gss::innards::HomomorphismAssignment,_true,_true>
           ._M_payload.super__Optional_payload_base<gss::innards::HomomorphismAssignment>._M_payload
      ;
      std::
      vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ::emplace_back<gss::innards::HomomorphismAssignmentInformation>
                (&assignments->values,(HomomorphismAssignmentInformation *)&mapping);
      this_00 = ((__shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> *)
                &local_d0->assignment)->_M_ptr;
      if (this_00 != (Proof *)0x0) {
        HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
                  ((NamedVertex *)&mapping,this->model,
                   current_assignment.
                   super__Optional_base<gss::innards::HomomorphismAssignment,_true,_true>._M_payload
                   .super__Optional_payload_base<gss::innards::HomomorphismAssignment>._M_payload.
                   _M_value.pattern_vertex);
        HomomorphismModel::target_vertex_for_proof_abi_cxx11_
                  ((NamedVertex *)local_98,this->model,
                   current_assignment.
                   super__Optional_base<gss::innards::HomomorphismAssignment,_true,_true>._M_payload
                   .super__Optional_payload_base<gss::innards::HomomorphismAssignment>._M_payload.
                   _M_value.target_vertex);
        Proof::unit_propagating(this_00,(NamedVertex *)&mapping,(NamedVertex *)local_98);
        std::__cxx11::string::~string((string *)(local_98 + 8));
        std::__cxx11::string::~string((string *)&mapping._M_t._M_impl.super__Rb_tree_header);
      }
      bVar8 = might_have_watches(this->params);
      if (bVar8) {
        local_ec = 0;
        uVar14 = current_assignment.
                 super__Optional_base<gss::innards::HomomorphismAssignment,_true,_true>._M_payload.
                 super__Optional_payload_base<gss::innards::HomomorphismAssignment>._M_payload.
                 _M_value.pattern_vertex;
        uVar11 = current_assignment.
                 super__Optional_base<gss::innards::HomomorphismAssignment,_true,_true>._M_payload.
                 super__Optional_payload_base<gss::innards::HomomorphismAssignment>._M_payload.
                 _M_value.target_vertex;
        p_Var16 = (_List_node_base *)
                  ((this->watches).table.data.
                   super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                  ((this->watches).table.target_size * uVar14 + uVar11));
        cVar17._M_node = p_Var16;
LAB_0012b9fa:
        cVar17._M_node =
             (((_List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                *)&(cVar17._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        while (cVar17._M_node != p_Var16) {
          p_Var3 = cVar17._M_node[1]._M_next;
          p_Var15 = p_Var3[1]._M_next;
          if ((*(uint *)&p_Var15->_M_next != uVar14) ||
             (*(uint *)((long)&p_Var15->_M_next + 4) != uVar11)) {
            _Var7 = (_List_node_base)vpermilps_avx((undefined1  [16])*p_Var15,0x4e);
            *p_Var15 = _Var7;
            p_Var15 = p_Var3[1]._M_next;
          }
          p_Var15 = p_Var15 + 1;
          while( true ) {
            if (p_Var15 == p_Var3[1]._M_prev) {
              p_Var3 = p_Var3[1]._M_next;
              pHVar18 = (__range4->
                        super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              goto LAB_0012babd;
            }
            bVar8 = HomomorphismAssignments::contains(assignments,(HomomorphismAssignment *)p_Var15)
            ;
            if (!bVar8) break;
            p_Var15 = (_List_node_base *)&p_Var15->_M_prev;
          }
          p_Var4 = (p_Var3[1]._M_next)->_M_next;
          (p_Var3[1]._M_next)->_M_next = p_Var15->_M_next;
          p_Var15->_M_next = p_Var4;
          p_Var3 = (p_Var3[1]._M_next)->_M_next;
          std::__cxx11::
          list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
          ::push_back((local_e0->watches).table.data.
                      super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                      ((local_e0->watches).table.target_size * (int)p_Var3 +
                      (int)((ulong)p_Var3 >> 0x20)),(value_type *)(cVar17._M_node + 1));
          p_Var3 = (cVar17._M_node)->_M_next;
          std::__cxx11::
          list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
          ::erase((list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                   *)p_Var16,cVar17);
          cVar17._M_node = p_Var3;
        }
        this = local_e0;
        if ((local_ec & 1) != 0) {
          return false;
        }
      }
      bVar8 = propagate_simple_constraints
                        (this,__range4,(HomomorphismAssignment *)&current_assignment);
      if (!bVar8) {
        return false;
      }
    }
    this_02 = (HomomorphismSearcher *)&find_unit_domain;
    bVar8 = HomomorphismModel::has_less_thans(this->model);
    if ((bVar8) && (bVar8 = propagate_less_thans(this,__range4), !bVar8)) {
      return false;
    }
    bVar8 = HomomorphismModel::has_occur_less_thans(this->model);
    if ((bVar8) &&
       (bVar8 = propagate_occur_less_thans(this,&current_assignment,assignments,__range4), !bVar8))
    {
      return false;
    }
    if ((this->params->injectivity == Injective) &&
       (bVar8 = cheap_all_different(this->model->target_size,__range4,
                                    (shared_ptr<gss::innards::Proof> *)local_d0,this->model), !bVar8
       )) {
      return false;
    }
    _Var13 = propagate::anon_class_8_1_52b55ef0::operator()((anon_class_8_1_52b55ef0 *)this_02);
    bVar9 = 1;
  }
  dcount = 0;
  if ((this->params->lackey)._M_t.
      super___uniq_ptr_impl<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>._M_t.
      super__Tuple_impl<0UL,_gss::innards::Lackey_*,_std::default_delete<gss::innards::Lackey>_>.
      super__Head_base<0UL,_gss::innards::Lackey_*,_false>._M_head_impl == (Lackey *)0x0) {
    return true;
  }
  if ((!propagate_using_lackey) && (this->params->send_partials_to_lackey != true)) {
    return true;
  }
  mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &mapping._M_t._M_impl.super__Rb_tree_header._M_header;
  mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
  mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
  mapping._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  expand_to_full_result(this_02,assignments,&mapping);
  if (propagate_using_lackey) {
    wipeout = false;
    local_98._0_4_ = -1;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&current_assignment,
               (ulong)local_e0->model->pattern_size,(value_type_conflict1 *)local_98,&local_d1);
    pHVar18 = (__range4->
              super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pHVar6 = (__range4->
             super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (uVar14 = 0; (ulong)uVar14 < (ulong)(((long)pHVar6 - (long)pHVar18) / 0x98);
        uVar14 = uVar14 + 1) {
      *(uint *)((long)current_assignment.
                      super__Optional_base<gss::innards::HomomorphismAssignment,_true,_true>.
                      _M_payload.super__Optional_payload_base<gss::innards::HomomorphismAssignment>.
                      _M_payload + (ulong)pHVar18[uVar14].v * 4) = uVar14;
    }
    this_01 = (local_e0->params->lackey)._M_t.
              super___uniq_ptr_impl<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>
              ._M_t.
              super__Tuple_impl<0UL,_gss::innards::Lackey_*,_std::default_delete<gss::innards::Lackey>_>
              .super__Head_base<0UL,_gss::innards::Lackey_*,_false>._M_head_impl;
    local_98._0_8_ = (void *)0x0;
    local_98._8_8_ = (pointer)0x0;
    p_Stack_88 = (_Manager_type)0x0;
    apcStack_80[0] = (code *)0x0;
    local_98._0_8_ = operator_new(0x20);
    *(bool **)local_98._0_8_ = &wipeout;
    *(vector<int,_std::allocator<int>_> **)(local_98._0_8_ + 8) =
         (vector<int,_std::allocator<int>_> *)&current_assignment;
    apcStack_80[0] =
         std::
         _Function_handler<bool_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_searcher.cc:840:29)>
         ::_M_invoke;
    *(Domains **)(local_98._0_8_ + 0x10) = __range4;
    *(int **)(local_98._0_8_ + 0x18) = &dcount;
    p_Stack_88 = std::
                 _Function_handler<bool_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_searcher.cc:840:29)>
                 ::_M_manager;
    bVar10 = Lackey::check_solution
                       (this_01,&mapping,true,false,(function<bool_(int,_int)> *)local_98);
    bVar8 = wipeout;
    std::_Function_base::~_Function_base((_Function_base *)local_98);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&current_assignment);
    if ((!bVar10) || ((bVar8 & 1U) != 0)) {
LAB_0012bd85:
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&mapping._M_t);
      return false;
    }
  }
  else {
    local_98._0_8_ = (long *)0x0;
    local_98._8_8_ = (pointer)0x0;
    p_Stack_88 = (_Manager_type)0x0;
    apcStack_80[0] = (code *)0x0;
    bVar8 = Lackey::check_solution
                      ((local_e0->params->lackey)._M_t.
                       super___uniq_ptr_impl<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Lackey_*,_std::default_delete<gss::innards::Lackey>_>
                       .super__Head_base<0UL,_gss::innards::Lackey_*,_false>._M_head_impl,&mapping,
                       true,false,(function<bool_(int,_int)> *)local_98);
    std::_Function_base::~_Function_base((_Function_base *)local_98);
    if (!bVar8) goto LAB_0012bd85;
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&mapping._M_t);
  return true;
LAB_0012b84d:
  if (pHVar18 ==
      (__range4->
      super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
      )._M_impl.super__Vector_impl_data._M_finish) goto LAB_0012b78e;
  if (pHVar18->v == *(uint *)&p_Var3->_M_prev) {
    bVar8 = SVOBitset::test(&pHVar18->values,*(int *)((long)&p_Var3->_M_prev + 4));
    if (bVar8) {
      SVOBitset::reset(&pHVar18->values,*(int *)((long)&p_Var3->_M_prev + 4));
      puVar1 = &pHVar18->count;
      *puVar1 = *puVar1 - 1;
      local_ec = CONCAT31((int3)(local_ec >> 8),(byte)local_ec | *puVar1 == 0);
    }
    goto LAB_0012b78e;
  }
  pHVar18 = pHVar18 + 1;
  goto LAB_0012b84d;
LAB_0012babd:
  if (pHVar18 ==
      (__range4->
      super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
      )._M_impl.super__Vector_impl_data._M_finish) goto LAB_0012b9fa;
  if ((pHVar18->fixed == false) && (pHVar18->v == *(uint *)&p_Var3->_M_prev)) {
    bVar8 = SVOBitset::test(&pHVar18->values,*(int *)((long)&p_Var3->_M_prev + 4));
    if (bVar8) {
      SVOBitset::reset(&pHVar18->values,*(int *)((long)&p_Var3->_M_prev + 4));
      puVar1 = &pHVar18->count;
      *puVar1 = *puVar1 - 1;
      local_ec = CONCAT31((int3)(local_ec >> 8),(byte)local_ec | *puVar1 == 0);
    }
    goto LAB_0012b9fa;
  }
  pHVar18 = pHVar18 + 1;
  goto LAB_0012babd;
}

Assistant:

auto HomomorphismSearcher::propagate(bool initial, Domains & new_domains, HomomorphismAssignments & assignments, bool propagate_using_lackey) -> bool
{
    // nogoods might be watching things in initial assignments. this is possibly not the
    // best place to put this...
    if (initial && might_have_watches(params)) {
        for (auto & a : assignments.values) {
            HomomorphismAssignment current_assignment = {a.assignment.pattern_vertex, a.assignment.target_vertex};
            bool wipeout = false;
            watches.propagate(
                current_assignment,
                [&](const HomomorphismAssignment & a) { return ! assignments.contains(a); },
                [&](const HomomorphismAssignment & a) {
                    for (auto & d : new_domains) {
                        if (d.v == a.pattern_vertex) {
                            if (d.values.test(a.target_vertex)) {
                                d.values.reset(a.target_vertex);
                                if (0 == --d.count)
                                    wipeout = true;
                            }
                            break;
                        }
                    }
                });

            if (wipeout)
                return false;
        }
    }

    auto find_unit_domain = [&]() {
        return find_if(new_domains.begin(), new_domains.end(), [](HomomorphismDomain & d) {
            return (! d.fixed) && 1 == d.count;
        });
    };

    bool done_globals_at_least_once = false;

    // whilst we've got a unit domain...
    for (typename Domains::iterator branch_domain = find_unit_domain();
         branch_domain != new_domains.end() || ! done_globals_at_least_once;
         branch_domain = find_unit_domain()) {
        optional<HomomorphismAssignment> current_assignment;
        if (branch_domain != new_domains.end()) {
            // what are we assigning?
            current_assignment = HomomorphismAssignment{branch_domain->v, unsigned(branch_domain->values.find_first())};

            // ok, make the assignment
            branch_domain->fixed = true;
            assignments.values.push_back({*current_assignment, false, -1, -1});

            if (proof)
                proof->unit_propagating(
                    model.pattern_vertex_for_proof(current_assignment->pattern_vertex),
                    model.target_vertex_for_proof(current_assignment->target_vertex));

            // propagate watches
            if (might_have_watches(params)) {
                bool wipeout = false;
                watches.propagate(
                    *current_assignment,
                    [&](const HomomorphismAssignment & a) { return ! assignments.contains(a); },
                    [&](const HomomorphismAssignment & a) {
                        for (auto & d : new_domains) {
                            if (d.fixed)
                                continue;

                            if (d.v == a.pattern_vertex) {
                                if (d.values.test(a.target_vertex)) {
                                    d.values.reset(a.target_vertex);
                                    if (0 == --d.count)
                                        wipeout = true;
                                }
                                break;
                            }
                        }
                    });

                if (wipeout)
                    return false;
            }

            // propagate simple all different and adjacency
            if (! propagate_simple_constraints(new_domains, *current_assignment))
                return false;
        }

        // propagate less thans
        if (model.has_less_thans() && ! propagate_less_thans(new_domains))
            return false;
        if (model.has_occur_less_thans() && ! propagate_occur_less_thans(current_assignment, assignments, new_domains))
            return false;

        // propagate all different
        if (params.injectivity == Injectivity::Injective)
            if (! cheap_all_different(model.target_size, new_domains, proof, &model))
                return false;
        done_globals_at_least_once = true;
    }

    int dcount = 0;
    if (params.lackey && (propagate_using_lackey || params.send_partials_to_lackey)) {
        VertexToVertexMapping mapping;
        expand_to_full_result(assignments, mapping);

        if (! propagate_using_lackey) {
            if (! params.lackey->check_solution(mapping, true, false, Lackey::DeletionFunction{}))
                return false;
        }
        else {
            bool wipeout = false;
            vector<int> find_domain(model.pattern_size, -1);
            for (unsigned i = 0; i < new_domains.size(); ++i)
                find_domain[new_domains[i].v] = i;

            auto deletion = [&](int p, int t) -> bool {
                if (! wipeout) {
                    if (int d = find_domain[p]; d != -1) {
                        if (new_domains[d].values.test(t)) {
                            ++dcount;
                            new_domains[d].values.reset(t);
                            if (0 == --new_domains[d].count)
                                wipeout = true;
                            return true;
                        }
                    }
                }
                return false;
            };

            if (! params.lackey->check_solution(mapping, true, false, deletion) || wipeout)
                return false;
        }
    }

    return true;
}